

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O2

void set_commands_for_sel_values
               (Am_Object *cmd,Am_Value *clicked_obj,Am_Value *new_value,Am_Value *old_value,
               bool set_extras,Am_String *new_label,Am_Which_Sel_Direction dir,bool extend)

{
  bool bVar1;
  undefined3 in_register_00000081;
  
  Am_Object::Set(cmd,0x16c,old_value,0);
  Am_Object::Set(cmd,0x169,new_value,0);
  Am_Object::Set(cmd,0x16d,clicked_obj,0);
  if (CONCAT31(in_register_00000081,set_extras) != 0) {
    Am_Object::Set(cmd,0xef,dir,1);
    Am_Object::Set(cmd,0x1a0,extend,1);
    bVar1 = Am_String::Valid(new_label);
    if (bVar1) {
      Am_Object::Set(cmd,0x150,new_label,0);
      return;
    }
  }
  return;
}

Assistant:

void
set_commands_for_sel_values(Am_Object &cmd, Am_Value clicked_obj,
                            Am_Value new_value, Am_Value old_value,
                            bool set_extras, Am_String new_label = Am_No_String,
                            Am_Which_Sel_Direction dir = Am_Sel_NONE,
                            bool extend = false)
{
  Am_INTER_TRACE_PRINT(Am_INTER_TRACE_SETTING,
                       "++ Setting into " << cmd << " old " << old_value
                                          << " new " << new_value);
  cmd.Set(Am_OLD_VALUE, old_value);
  cmd.Set(Am_VALUE, new_value);
  cmd.Set(Am_OBJECT_MODIFIED, clicked_obj);
  if (set_extras) {
    cmd.Set(Am_CURRENT_DIRECTION, (int)dir, Am_OK_IF_NOT_THERE);
    cmd.Set(Am_MULTI_SELECTIONS, extend, Am_OK_IF_NOT_THERE);
    if (new_label.Valid())
      cmd.Set(Am_LABEL, new_label);
  }
}